

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O3

void __thiscall PVector::PVector(PVector *this)

{
  PFloat *pPVar1;
  uint uVar2;
  
  pPVar1 = TypeFloat32;
  PType::PType((PType *)this);
  (this->super_PArray).ElementType = (PType *)pPVar1;
  (this->super_PArray).ElementCount = 3;
  uVar2 = (pPVar1->super_PBasicType).super_PType.Align;
  (this->super_PArray).super_PCompoundType.super_PType.Align = uVar2;
  uVar2 = -uVar2 & (*(int *)&(pPVar1->super_PBasicType).super_PType.super_DObject.field_0x24 + uVar2
                   ) - 1;
  (this->super_PArray).ElementSize = uVar2;
  *(uint *)&(this->super_PArray).super_PCompoundType.super_PType.super_DObject.field_0x24 =
       uVar2 * 3;
  (this->super_PArray).super_PCompoundType.super_PType.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_0086ded0;
  return;
}

Assistant:

PVector::PVector()
: PArray(TypeFloat32, 3)
{
}